

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

Builder * capnp::compiler::anon_unknown_0::initDecl
                    (Builder *__return_storage_ptr__,Builder builder,
                    Located<capnp::Text::Reader> *name,
                    Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *id,
                    Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
                    *genericParameters,
                    Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                    *annotations)

{
  Builder builder_00;
  uint index;
  Orphan<capnp::compiler::LocatedInteger> *i;
  Builder list;
  Builder local_88;
  Builder local_58;
  
  Declaration::Builder::initName(&local_58,&builder);
  local_88._builder.dataSize = local_58._builder.dataSize;
  local_88._builder.pointerCount = local_58._builder.pointerCount;
  local_88._builder._38_2_ = local_58._builder._38_2_;
  local_88._builder.data = local_58._builder.data;
  local_88._builder.pointers = local_58._builder.pointers;
  local_88._builder.segment = local_58._builder.segment;
  local_88._builder.capTable = local_58._builder.capTable;
  LocatedText::Builder::setValue(&local_88,(Reader)(name->value).super_StringPtr.content);
  *(undefined8 *)local_88._builder.data = *(undefined8 *)&name->startByte;
  if ((id->ptr).isSet == true) {
    local_88._builder.dataSize = builder._builder.dataSize;
    local_88._builder.pointerCount = builder._builder.pointerCount;
    local_88._builder._38_2_ = builder._builder._38_2_;
    local_88._builder.data = builder._builder.data;
    local_88._builder.pointers = builder._builder.pointers;
    local_88._builder.segment = builder._builder.segment;
    local_88._builder.capTable = builder._builder.capTable;
    Declaration::Id::Builder::adoptUid((Builder *)&local_88,&(id->ptr).field_1.value);
  }
  builder_00._builder.capTable = builder._builder.capTable;
  builder_00._builder.segment = builder._builder.segment;
  builder_00._builder.data = builder._builder.data;
  builder_00._builder.pointers = builder._builder.pointers;
  builder_00._builder.dataSize = builder._builder.dataSize;
  builder_00._builder.pointerCount = builder._builder.pointerCount;
  builder_00._builder._38_2_ = builder._builder._38_2_;
  initGenericParams(builder_00,genericParameters);
  Declaration::Builder::initAnnotations((Builder *)&local_88,&builder,(uint)annotations->size_);
  for (index = 0; (ulong)index < annotations->size_; index = index + 1) {
    List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Builder::
    adoptWithCaveats((Builder *)&local_88,index,annotations->ptr + index);
  }
  (__return_storage_ptr__->_builder).dataSize = builder._builder.dataSize;
  (__return_storage_ptr__->_builder).pointerCount = builder._builder.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = builder._builder._38_2_;
  (__return_storage_ptr__->_builder).data = builder._builder.data;
  (__return_storage_ptr__->_builder).pointers = builder._builder.pointers;
  (__return_storage_ptr__->_builder).segment = builder._builder.segment;
  (__return_storage_ptr__->_builder).capTable = builder._builder.capTable;
  return __return_storage_ptr__;
}

Assistant:

static Declaration::Builder initDecl(
    Declaration::Builder builder, Located<Text::Reader>&& name,
    kj::Maybe<Orphan<LocatedInteger>>&& id,
    kj::Maybe<Located<kj::Array<kj::Maybe<Located<Text::Reader>>>>>&& genericParameters,
    kj::Array<Orphan<Declaration::AnnotationApplication>>&& annotations) {
  name.copyTo(builder.initName());
  KJ_IF_SOME(i, id) {
    builder.getId().adoptUid(kj::mv(i));
  }

  initGenericParams(builder, kj::mv(genericParameters));

  auto list = builder.initAnnotations(annotations.size());
  for (uint i = 0; i < annotations.size(); i++) {
    list.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
  return builder;
}